

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommunicationsChannelType.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::CommunicationsChannelType::Decode
          (CommunicationsChannelType *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  allocator<char> local_39;
  KString local_38;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 != 0) {
    KDataStream::Read(stream,&(this->field_0).m_ui8CommChannelType);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
  KException::KException(this_00,&local_38,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void CommunicationsChannelType::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < COMM_CHANNEL_TYPE_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui8CommChannelType;
}